

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_counters.cpp
# Opt level: O2

counters * __thiscall libtorrent::counters::operator=(counters *this,counters *c)

{
  int i;
  long lVar1;
  
  if (c != this) {
    for (lVar1 = 0; lVar1 != 0x123; lVar1 = lVar1 + 1) {
      (this->m_stats_counter).super_array<std::atomic<long>,_291UL>._M_elems[lVar1].
      super___atomic_base<long>._M_i =
           (c->m_stats_counter).super_array<std::atomic<long>,_291UL>._M_elems[lVar1].
           super___atomic_base<long>._M_i;
    }
  }
  return this;
}

Assistant:

counters& counters::operator=(counters const& c) & TORRENT_COUNTER_NOEXCEPT
	{
		if (&c == this) return *this;
#ifdef ATOMIC_LLONG_LOCK_FREE
		for (int i = 0; i < m_stats_counter.end_index(); ++i)
			m_stats_counter[i].store(
				c.m_stats_counter[i].load(std::memory_order_relaxed)
					, std::memory_order_relaxed);
#else
		std::lock_guard<std::mutex> l(m_mutex);
		std::lock_guard<std::mutex> l2(c.m_mutex);
		m_stats_counter = c.m_stats_counter;
#endif
		return *this;
	}